

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenTest.cpp
# Opt level: O2

void __thiscall UnitTest1::CodeGenTest::DryParserGenTest1(CodeGenTest *this)

{
  uint64_t uVar1;
  uint64_t uVar2;
  char *in_RSI;
  char *__stat_loc;
  StringLogger logger;
  Grammar<unsigned_char> grammar;
  stat st;
  DryParserEM64T<unsigned_char> parser;
  char msg [256];
  Stage1Runner runner;
  
  LoadGrammar<unsigned_char>(&grammar,in_RSI);
  Centaurus::Grammar<unsigned_char>::optimize(&grammar);
  asmjit::StringLogger::StringLogger(&logger);
  Centaurus::DryParserEM64T<unsigned_char>::DryParserEM64T(&parser,&grammar,&logger.super_Logger);
  stat("../../datasets/citylots.json",(stat *)&st);
  __stat_loc = "../../datasets/citylots.json";
  Centaurus::Stage1Runner::Stage1Runner
            (&runner,"../../datasets/citylots.json",&parser.super_IParser,0x800000,8,false,false);
  uVar1 = get_us_clock();
  Centaurus::BaseRunner::_start<Centaurus::Stage1Runner>(&runner.super_BaseRunner);
  Centaurus::BaseRunner::wait(&runner.super_BaseRunner,__stat_loc);
  uVar2 = get_us_clock();
  sprintf(msg,"Elapsed time: %lu[ms]\r\n",(uVar2 - uVar1) / 1000);
  Microsoft::VisualStudio::CppUnitTestFramework::Logger::WriteMessage(msg);
  sprintf(msg,"Throughput: %lu[MB/s]\r\n",(ulong)st.st_size / (uVar2 - uVar1));
  Microsoft::VisualStudio::CppUnitTestFramework::Logger::WriteMessage(msg);
  Microsoft::VisualStudio::CppUnitTestFramework::Assert::IsTrue
            (runner.m_result != (void *)0x0,(wchar_t *)0x0);
  Centaurus::Stage1Runner::~Stage1Runner(&runner);
  Centaurus::DryParserEM64T<unsigned_char>::~DryParserEM64T(&parser);
  asmjit::StringLogger::~StringLogger(&logger);
  Centaurus::Grammar<unsigned_char>::~Grammar(&grammar);
  return;
}

Assistant:

TEST_METHOD(DryParserGenTest1)
    {
        using namespace Centaurus;

        Grammar<unsigned char> grammar = LoadGrammar<unsigned char>("../../grammar/json2.cgr");
        //Grammar<unsigned char> grammar = LoadGrammar<unsigned char>("grammar/xml.cgr");

		grammar.optimize();

		/*FILE *logFile;
		fopen_s(&logFile, "parser.asm", "w");
        asmjit::FileLogger logger(logFile);*/

        asmjit::StringLogger logger;
		
        DryParserEM64T<unsigned char> parser(grammar, &logger);

        //std::cout << logger.getString() << std::endl;

		//fclose(logFile);

        //Logger::WriteMessage(logger.getString());

        //MappedFileInput json("/home/ihara/Downloads/sf-city-lots-json-master/citylots.json");

#if defined(CENTAURUS_BUILD_WINDOWS)
		const char *input_path = "..\\..\\datasets\\citylots.json";
		//const char *input_path = "test2.json";
#elif defined(CENTAURUS_BUILD_LINUX)
        const char *input_path = "../../datasets/citylots.json";
#endif
        struct stat st;
        stat(input_path, &st);

        Stage1Runner runner{input_path, &parser, 8 * 1024 * 1024, 8};

		uint64_t start_time = get_us_clock();

        runner.start();
        runner.wait();

		uint64_t end_time = get_us_clock();

		char msg[256];
		sprintf(msg, "Elapsed time: %lu[ms]\r\n", (end_time - start_time) / 1000);
		Logger::WriteMessage(msg);

        sprintf(msg, "Throughput: %lu[MB/s]\r\n", st.st_size / (end_time - start_time));
        Logger::WriteMessage(msg);

        //Assert::AreEqual((const void *)(json + strlen(json)), context.result);
        Assert::IsTrue(runner.get_result() != NULL);

        //_aligned_free(json);
    }